

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O0

Maybe<unsigned_int> __thiscall
capnp::compiler::NodeTranslator::StructLayout::Group::DataLocationUsage::smallestHoleAtLeast
          (DataLocationUsage *this,DataLocation *location,uint lgSize)

{
  NullableValue<unsigned_int> *other;
  uint *puVar1;
  uint in_ECX;
  undefined4 in_register_00000014;
  uint local_4c [6];
  Maybe<unsigned_int> local_34;
  NullableValue<unsigned_int> local_2c;
  NullableValue<unsigned_int> result;
  uint lgSize_local;
  DataLocation *location_local;
  DataLocationUsage *this_local;
  
  register0x00000010 = (uint *)CONCAT44(in_register_00000014,lgSize);
  if ((location->lgSize & 1) == 0) {
    if (*register0x00000010 < in_ECX) {
      kj::Maybe<unsigned_int>::Maybe((Maybe<unsigned_int> *)this,(void *)0x0);
    }
    else {
      kj::Maybe<unsigned_int>::Maybe((Maybe<unsigned_int> *)this,register0x00000010);
    }
  }
  else if (in_ECX < *(byte *)((long)&location->lgSize + 1)) {
    HoleSet<unsigned_char>::smallestAtLeast((HoleSet<unsigned_char> *)&local_34,(int)location + 2);
    other = kj::_::readMaybe<unsigned_int>(&local_34);
    kj::_::NullableValue<unsigned_int>::NullableValue(&local_2c,other);
    kj::Maybe<unsigned_int>::~Maybe(&local_34);
    puVar1 = kj::_::NullableValue::operator_cast_to_unsigned_int_((NullableValue *)&local_2c);
    if (puVar1 == (uint *)0x0) {
      if ((uint)*(byte *)((long)&location->lgSize + 1) < *stack0xffffffffffffffe0) {
        local_4c[0] = (uint)*(byte *)((long)&location->lgSize + 1);
        kj::Maybe<unsigned_int>::Maybe((Maybe<unsigned_int> *)this,local_4c);
      }
      else {
        kj::Maybe<unsigned_int>::Maybe((Maybe<unsigned_int> *)this,(void *)0x0);
      }
    }
    else {
      puVar1 = kj::_::NullableValue<unsigned_int>::operator*(&local_2c);
      kj::Maybe<unsigned_int>::Maybe((Maybe<unsigned_int> *)this,puVar1);
    }
    local_4c[1] = 1;
    kj::_::NullableValue<unsigned_int>::~NullableValue(&local_2c);
  }
  else if (in_ECX < *register0x00000010) {
    kj::Maybe<unsigned_int>::Maybe((Maybe<unsigned_int> *)this,(uint *)&result);
  }
  else {
    kj::Maybe<unsigned_int>::Maybe((Maybe<unsigned_int> *)this,(void *)0x0);
  }
  return (Maybe<unsigned_int>)(NullableValue<unsigned_int>)this;
}

Assistant:

kj::Maybe<uint> smallestHoleAtLeast(Union::DataLocation& location, uint lgSize) {
        // Find the smallest single hole that is at least the given size.  This is used to find the
        // optimal place to allocate each field -- it is placed in the smallest slot where it fits,
        // to reduce fragmentation.  Returns the size of the hole, if found.

        if (!isUsed) {
          // The location is effectively one big hole.
          if (lgSize <= location.lgSize) {
            return location.lgSize;
          } else {
            return nullptr;
          }
        } else if (lgSize >= lgSizeUsed) {
          // Requested size is at least our current usage, so clearly won't fit in any current
          // holes, but if the location's size is larger than what we're using, we'd be able to
          // expand.
          if (lgSize < location.lgSize) {
            return lgSize;
          } else {
            return nullptr;
          }
        } else KJ_IF_MAYBE(result, holes.smallestAtLeast(lgSize)) {
          // There's a hole.
          return *result;
        } else {
          // The requested size is smaller than what we're already using, but there are no holes
          // available.  If we could double our size, then we could allocate in the new space.

          if (lgSizeUsed < location.lgSize) {
            // We effectively create a new hole the same size as the current usage.
            return lgSizeUsed;
          } else {
            return nullptr;
          }
        }
      }